

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

void __thiscall wallet::SQLiteBatch::SQLiteBatch(SQLiteBatch *this,SQLiteDatabase *database)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_DatabaseBatch)._vptr_DatabaseBatch = (_func_int **)&PTR_ReadKey_01155c10;
  this->m_database = database;
  std::make_unique<wallet::SQliteExecHandler>();
  *(undefined8 *)((long)&this->m_delete_stmt + 1) = 0;
  *(undefined8 *)((long)&this->m_delete_prefix_stmt + 1) = 0;
  this->m_overwrite_stmt = (sqlite3_stmt *)0x0;
  this->m_delete_stmt = (sqlite3_stmt *)0x0;
  this->m_read_stmt = (sqlite3_stmt *)0x0;
  this->m_insert_stmt = (sqlite3_stmt *)0x0;
  if (this->m_database->m_db == (sqlite3 *)0x0) {
    __assert_fail("m_database.m_db",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
                  ,0x193,"wallet::SQLiteBatch::SQLiteBatch(SQLiteDatabase &)");
  }
  SetupSQLStatements(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLiteBatch::SQLiteBatch(SQLiteDatabase& database)
    : m_database(database)
{
    // Make sure we have a db handle
    assert(m_database.m_db);

    SetupSQLStatements();
}